

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O2

void testDeepImage(string *tempDir)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  Box<Imath_3_2::Vec2<int>_> *pBVar5;
  Box<Imath_3_2::Vec2<int>_> *pBVar6;
  string *psVar7;
  DeepImageChannel *pDVar8;
  DeepImageChannel *pDVar9;
  DeepImageLevel *pDVar10;
  TypedDeepImageChannel<Imath_3_2::half> *pTVar11;
  int iVar12;
  allocator<char> local_219;
  DeepImage img2;
  int iStack_214;
  allocator<char> local_1a9;
  Rand48 random;
  undefined2 uStack_1a2;
  DeepImage img1;
  int iStack_134;
  Rand48 random_1;
  Header hdr;
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  allocator<char> local_50 [32];
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Testing class DeepImage");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&img1,tempDir,
                 "deepScanLines.exr");
  _img2 = 0;
  iStack_214 = 0;
  anon_unknown.dwarf_187f8::testScanLineImage((Box2i *)&img2,(string *)&img1);
  _img2 = -10;
  iStack_214 = -0x32;
  anon_unknown.dwarf_187f8::testScanLineImage((Box2i *)&img2,(string *)&img1);
  _img2 = 0x32;
  iStack_214 = 10;
  anon_unknown.dwarf_187f8::testScanLineImage((Box2i *)&img2,(string *)&img1);
  std::__cxx11::string::~string((string *)&img1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&img1,tempDir,
                 "deepTiles.exr");
  _img2 = 0;
  iStack_214 = 0;
  anon_unknown.dwarf_187f8::testTiledImage((Box2i *)&img2,(string *)&img1);
  _img2 = -10;
  iStack_214 = -0x32;
  anon_unknown.dwarf_187f8::testTiledImage((Box2i *)&img2,(string *)&img1);
  _img2 = 0x32;
  iStack_214 = 10;
  anon_unknown.dwarf_187f8::testTiledImage((Box2i *)&img2,(string *)&img1);
  std::__cxx11::string::~string((string *)&img1);
  _img1 = 0;
  iStack_134 = 0;
  anon_unknown.dwarf_187f8::testSetSampleCounts((Box2i *)&img1);
  _img1 = -10;
  iStack_134 = -0x32;
  anon_unknown.dwarf_187f8::testSetSampleCounts((Box2i *)&img1);
  _img1 = 0x32;
  iStack_134 = 10;
  anon_unknown.dwarf_187f8::testSetSampleCounts((Box2i *)&img1);
  poVar3 = std::operator<<((ostream *)&std::cout,"pixel shifting");
  std::endl<char,std::char_traits<char>>(poVar3);
  _img2 = 0xf;
  iStack_214 = 0x14;
  Imf_3_2::DeepImage::DeepImage(&img1,(Box *)&img2,MIPMAP_LEVELS,ROUND_DOWN);
  std::__cxx11::string::string<std::allocator<char>>((string *)&img2,"A",(allocator<char> *)&random)
  ;
  Imf_3_2::Image::insertChannel((string *)&img1,(PixelType)&img2,1,1,true);
  std::__cxx11::string::~string((string *)&img2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&img2,"B",(allocator<char> *)&random)
  ;
  Imf_3_2::Image::insertChannel((string *)&img1,(PixelType)&img2,1,1,true);
  std::__cxx11::string::~string((string *)&img2);
  _random = 0x140000000f;
  Imf_3_2::DeepImage::DeepImage(&img2,(Box *)&random,MIPMAP_LEVELS,ROUND_DOWN);
  std::__cxx11::string::string<std::allocator<char>>((string *)&random,"A",(allocator<char> *)&hdr);
  Imf_3_2::Image::insertChannel((string *)&img2,(PixelType)&random,1,1,true);
  std::__cxx11::string::~string((string *)&random);
  std::__cxx11::string::string<std::allocator<char>>((string *)&random,"B",(allocator<char> *)&hdr);
  Imf_3_2::Image::insertChannel((string *)&img2,(PixelType)&random,1,1,true);
  std::__cxx11::string::~string((string *)&random);
  poVar3 = std::operator<<((ostream *)&std::cout,"    generating random pixel values");
  std::endl<char,std::char_traits<char>>(poVar3);
  random._state[0] = 0x29ff;
  random._state[1] = 0xffff;
  random._state[2] = 0x29ff;
  anon_unknown.dwarf_187f8::fillChannels(&random,&img1);
  _random = CONCAT26(uStack_1a2,0x29ffffff29ff);
  anon_unknown.dwarf_187f8::fillChannels(&random,&img2);
  poVar3 = std::operator<<((ostream *)&std::cout,"    shifting, dx = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,5);
  poVar3 = std::operator<<(poVar3,", dy = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,7);
  std::endl<char,std::char_traits<char>>(poVar3);
  Imf_3_2::Image::shiftPixels((int)&img2,5);
  poVar3 = std::operator<<((ostream *)&std::cout,"    comparing");
  std::endl<char,std::char_traits<char>>(poVar3);
  anon_unknown.dwarf_187f8::verifyImagesAreEqual(&img1,&img2,5,7);
  Imf_3_2::DeepImage::~DeepImage(&img2);
  Imf_3_2::DeepImage::~DeepImage(&img1);
  std::operator+(&local_70,tempDir,"deepCropped.exr");
  poVar3 = std::operator<<((ostream *)&std::cout,"cropping an image");
  std::endl<char,std::char_traits<char>>(poVar3);
  _img2 = 10;
  iStack_214 = 0x14;
  Imf_3_2::DeepImage::DeepImage(&img1,(Box *)&img2,ONE_LEVEL,ROUND_DOWN);
  std::__cxx11::string::string<std::allocator<char>>((string *)&img2,"A",(allocator<char> *)&random)
  ;
  Imf_3_2::Image::insertChannel((string *)&img1,(PixelType)&img2,1,1,true);
  std::__cxx11::string::~string((string *)&img2);
  random_1._state[0] = 0x5a5a;
  random_1._state[1] = 0x5a5a;
  random_1._state[2] = 0x5a5a;
  poVar3 = std::operator<<((ostream *)&std::cout,"    generating random pixel values");
  std::endl<char,std::char_traits<char>>(poVar3);
  anon_unknown.dwarf_187f8::fillChannels(&random_1,&img1);
  _img2 = 0;
  iStack_214 = 0;
  Imf_3_2::Header::Header((Header *)0x3f800000,0x3f800000,&hdr,0x40,0x40,&img2,0,3);
  puVar4 = (undefined8 *)Imf_3_2::Header::dataWindow();
  *puVar4 = 0x3200000028;
  puVar4[1] = 0x460000003c;
  poVar3 = std::operator<<((ostream *)&std::cout,"    saving scan line file");
  std::endl<char,std::char_traits<char>>(poVar3);
  Imf_3_2::saveDeepScanLineImage((string *)&local_70,&hdr,&img1,USE_HEADER_DATA_WINDOW);
  poVar3 = std::operator<<((ostream *)&std::cout,"    loading file");
  std::endl<char,std::char_traits<char>>(poVar3);
  Imf_3_2::DeepImage::DeepImage(&img2);
  Imf_3_2::loadDeepImage((string *)&local_70,&img2);
  pBVar5 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Image::dataWindow();
  pBVar6 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Image::dataWindow();
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator!=(pBVar5,pBVar6);
  if (!bVar1) {
    __assert_fail("img2.dataWindow () != img1.dataWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                  ,0x1fe,"void (anonymous namespace)::testCropping(const string &)");
  }
  pBVar5 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Image::dataWindow();
  pBVar6 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar5,pBVar6);
  if (!bVar1) {
    __assert_fail("img2.dataWindow () == hdr.dataWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                  ,0x1ff,"void (anonymous namespace)::testCropping(const string &)");
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"    comparing");
  std::endl<char,std::char_traits<char>>(poVar3);
  psVar7 = (string *)Imf_3_2::DeepImage::level((int)&img2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&random,"A",local_50);
  pDVar8 = (DeepImageChannel *)Imf_3_2::DeepImageLevel::channel(psVar7);
  psVar7 = (string *)Imf_3_2::DeepImage::level((int)&img1);
  std::__cxx11::string::string<std::allocator<char>>(local_90,"A",&local_219);
  pDVar9 = (DeepImageChannel *)Imf_3_2::DeepImageLevel::channel(psVar7);
  anon_unknown.dwarf_187f8::verifyPixelsAreEqual<Imath_3_2::half>(pDVar8,pDVar9,0,0);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)&random);
  poVar3 = std::operator<<((ostream *)&std::cout,"    saving tiled file");
  std::endl<char,std::char_traits<char>>(poVar3);
  Imf_3_2::saveDeepTiledImage((string *)&local_70,&hdr,&img1,USE_HEADER_DATA_WINDOW);
  poVar3 = std::operator<<((ostream *)&std::cout,"    loading file");
  std::endl<char,std::char_traits<char>>(poVar3);
  Imf_3_2::DeepImage::DeepImage((DeepImage *)&random);
  Imf_3_2::loadDeepImage((string *)&local_70,(DeepImage *)&random);
  pBVar5 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Image::dataWindow();
  pBVar6 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Image::dataWindow();
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator!=(pBVar5,pBVar6);
  if (!bVar1) {
    __assert_fail("img3.dataWindow () != img1.dataWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                  ,0x20d,"void (anonymous namespace)::testCropping(const string &)");
  }
  pBVar5 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Image::dataWindow();
  pBVar6 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar5,pBVar6);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"    comparing");
    std::endl<char,std::char_traits<char>>(poVar3);
    psVar7 = (string *)Imf_3_2::DeepImage::level((int)&random);
    std::__cxx11::string::string<std::allocator<char>>(local_90,"A",&local_219);
    pDVar8 = (DeepImageChannel *)Imf_3_2::DeepImageLevel::channel(psVar7);
    psVar7 = (string *)Imf_3_2::DeepImage::level((int)&img1);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"A",&local_1a9);
    pDVar9 = (DeepImageChannel *)Imf_3_2::DeepImageLevel::channel(psVar7);
    anon_unknown.dwarf_187f8::verifyPixelsAreEqual<Imath_3_2::half>(pDVar8,pDVar9,0,0);
    std::__cxx11::string::~string((string *)local_50);
    std::__cxx11::string::~string(local_90);
    remove(local_70._M_dataplus._M_p);
    Imf_3_2::DeepImage::~DeepImage((DeepImage *)&random);
    Imf_3_2::DeepImage::~DeepImage(&img2);
    Imf_3_2::Header::~Header(&hdr);
    Imf_3_2::DeepImage::~DeepImage(&img1);
    std::__cxx11::string::~string((string *)&local_70);
    poVar3 = std::operator<<((ostream *)&std::cout,"channel renaming");
    std::endl<char,std::char_traits<char>>(poVar3);
    _img2 = 0xf;
    iStack_214 = 0x14;
    Imf_3_2::DeepImage::DeepImage(&img1,(Box *)&img2,MIPMAP_LEVELS,ROUND_DOWN);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&img2,"A",(allocator<char> *)&random);
    Imf_3_2::Image::insertChannel((string *)&img1,(PixelType)&img2,1,1,true);
    std::__cxx11::string::~string((string *)&img2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&img2,"B",(allocator<char> *)&random);
    iVar12 = 0;
    Imf_3_2::Image::insertChannel((string *)&img1,(PixelType)&img2,1,1,true);
    std::__cxx11::string::~string((string *)&img2);
    while( true ) {
      iVar2 = Imf_3_2::Image::numLevels();
      if (iVar2 <= iVar12) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&img2,"A",(allocator<char> *)&hdr);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&random,"C",(allocator<char> *)local_90);
        Imf_3_2::Image::renameChannel((string *)&img1,(string *)&img2);
        std::__cxx11::string::~string((string *)&random);
        std::__cxx11::string::~string((string *)&img2);
        iVar12 = 0;
        while( true ) {
          iVar2 = Imf_3_2::Image::numLevels();
          if (iVar2 <= iVar12) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&img2,"A",(allocator<char> *)&hdr);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&random,"D",(allocator<char> *)local_90);
            Imf_3_2::Image::renameChannel((string *)&img1,(string *)&img2);
            std::__cxx11::string::~string((string *)&random);
            std::__cxx11::string::~string((string *)&img2);
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                          ,0x238,"void (anonymous namespace)::testRenameChannel()");
          }
          pDVar10 = (DeepImageLevel *)Imf_3_2::DeepImage::level((int)&img1);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&img2,"A",(allocator<char> *)&random);
          pTVar11 = Imf_3_2::DeepImageLevel::findTypedChannel<Imath_3_2::half>
                              (pDVar10,(string *)&img2);
          if (pTVar11 != (TypedDeepImageChannel<Imath_3_2::half> *)0x0) {
            __assert_fail("level.findTypedChannel<half> (\"A\") == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                          ,0x22e,"void (anonymous namespace)::testRenameChannel()");
          }
          std::__cxx11::string::~string((string *)&img2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&img2,"B",(allocator<char> *)&random);
          pTVar11 = Imf_3_2::DeepImageLevel::findTypedChannel<Imath_3_2::half>
                              (pDVar10,(string *)&img2);
          if (pTVar11 == (TypedDeepImageChannel<Imath_3_2::half> *)0x0) {
            __assert_fail("level.findTypedChannel<half> (\"B\") != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                          ,0x22f,"void (anonymous namespace)::testRenameChannel()");
          }
          std::__cxx11::string::~string((string *)&img2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&img2,"C",(allocator<char> *)&random);
          pTVar11 = Imf_3_2::DeepImageLevel::findTypedChannel<Imath_3_2::half>
                              (pDVar10,(string *)&img2);
          if (pTVar11 == (TypedDeepImageChannel<Imath_3_2::half> *)0x0) break;
          std::__cxx11::string::~string((string *)&img2);
          iVar12 = iVar12 + 1;
        }
        __assert_fail("level.findTypedChannel<half> (\"C\") != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                      ,0x230,"void (anonymous namespace)::testRenameChannel()");
      }
      pDVar10 = (DeepImageLevel *)Imf_3_2::DeepImage::level((int)&img1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&img2,"A",(allocator<char> *)&random);
      pTVar11 = Imf_3_2::DeepImageLevel::findTypedChannel<Imath_3_2::half>(pDVar10,(string *)&img2);
      if (pTVar11 == (TypedDeepImageChannel<Imath_3_2::half> *)0x0) {
        __assert_fail("level.findTypedChannel<half> (\"A\") != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                      ,0x224,"void (anonymous namespace)::testRenameChannel()");
      }
      std::__cxx11::string::~string((string *)&img2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&img2,"B",(allocator<char> *)&random);
      pTVar11 = Imf_3_2::DeepImageLevel::findTypedChannel<Imath_3_2::half>(pDVar10,(string *)&img2);
      if (pTVar11 == (TypedDeepImageChannel<Imath_3_2::half> *)0x0) break;
      std::__cxx11::string::~string((string *)&img2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&img2,"C",(allocator<char> *)&random);
      pTVar11 = Imf_3_2::DeepImageLevel::findTypedChannel<Imath_3_2::half>(pDVar10,(string *)&img2);
      if (pTVar11 != (TypedDeepImageChannel<Imath_3_2::half> *)0x0) {
        __assert_fail("level.findTypedChannel<half> (\"C\") == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                      ,0x226,"void (anonymous namespace)::testRenameChannel()");
      }
      std::__cxx11::string::~string((string *)&img2);
      iVar12 = iVar12 + 1;
    }
    __assert_fail("level.findTypedChannel<half> (\"B\") != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                  ,0x225,"void (anonymous namespace)::testRenameChannel()");
  }
  __assert_fail("img3.dataWindow () == hdr.dataWindow ()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                ,0x20e,"void (anonymous namespace)::testCropping(const string &)");
}

Assistant:

void
testDeepImage (const string& tempDir)
{
    try
    {
        cout << "Testing class DeepImage" << endl;

        testScanLineImages (tempDir + "deepScanLines.exr");
        testTiledImages (tempDir + "deepTiles.exr");
        testSetSampleCounts ();
        testShiftPixels ();
        testCropping (tempDir + "deepCropped.exr");
        testRenameChannel ();
        testRenameChannels ();

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}